

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PipelineClient::writeTarget
          (PipelineClient *this,Builder target)

{
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar3;
  long in_RSI;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar4;
  Orphanage orphanage;
  Builder builder;
  OrphanBuilder OStack_98;
  StructBuilder local_78;
  StructBuilder local_50;
  
  *(undefined2 *)((long)target._builder.data + 4) = 1;
  local_78.segment = target._builder.segment;
  local_78.capTable = target._builder.capTable;
  local_78.data = target._builder.pointers;
  PointerBuilder::initStruct(&local_50,(PointerBuilder *)&local_78,(StructSize)0x10001);
  *(undefined4 *)local_50.data = *(undefined4 *)(*(long *)(in_RSI + 0x48) + 0x20);
  local_78.dataSize = local_50.dataSize;
  local_78.pointerCount = local_50.pointerCount;
  local_78._38_2_ = local_50._38_2_;
  local_78.data = local_50.data;
  local_78.pointers = local_50.pointers;
  local_78.segment = local_50.segment;
  local_78.capTable = local_50.capTable;
  pBVar1 = StructBuilder::getArena(&local_78);
  pCVar2 = StructBuilder::getCapTable(&local_78);
  orphanage.capTable = pCVar2;
  orphanage.arena = pBVar1;
  anon_unknown_18::fromPipelineOps
            ((Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> *)&OStack_98,
             orphanage,*(ArrayPtr<const_capnp::PipelineOp> *)(in_RSI + 0x50));
  local_78.segment = local_50.segment;
  local_78.capTable = local_50.capTable;
  local_78.data = local_50.pointers;
  PointerBuilder::adopt((PointerBuilder *)&local_78,&OStack_98);
  pCVar3 = extraout_RDX;
  if (OStack_98.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&OStack_98);
    pCVar3 = extraout_RDX_00;
  }
  (this->super_RpcClient).super_ClientHook._vptr_ClientHook = (_func_int **)0x0;
  (this->super_RpcClient).super_ClientHook.brand = (void *)0x0;
  MVar4.ptr.ptr = pCVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      auto builder = target.initPromisedAnswer();
      builder.setQuestionId(questionRef->getId());
      builder.adoptTransform(fromPipelineOps(Orphanage::getForMessageContaining(builder), ops));
      return kj::none;
    }